

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseInt<unsigned_int>(char *s,char *end,uint *out,ParseIntType parse_type)

{
  char cVar1;
  Result RVar2;
  Enum EVar3;
  ulong in_RAX;
  bool bVar4;
  uint64_t value;
  ulong local_18;
  
  cVar1 = *s;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    if (parse_type == UnsignedOnly) {
      return (Result)Error;
    }
    bVar4 = cVar1 == '-';
    s = s + 1;
  }
  else {
    bVar4 = false;
  }
  local_18 = in_RAX;
  RVar2 = ParseUint64(s,end,&local_18);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    if (bVar4) {
      if (0x80000000 < local_18) {
        return (Result)Error;
      }
      local_18 = 0x100000000 - local_18;
    }
    else if (local_18 >> 0x20 != 0) {
      return (Result)Error;
    }
    *out = (uint)local_18;
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result ParseInt(const char* s,
                const char* end,
                U* out,
                ParseIntType parse_type) {
  typedef typename std::make_signed<U>::type S;
  uint64_t value;
  bool has_sign = false;
  if (*s == '-' || *s == '+') {
    if (parse_type == ParseIntType::UnsignedOnly) {
      return Result::Error;
    }
    if (*s == '-') {
      has_sign = true;
    }
    s++;
  }
  CHECK_RESULT(ParseUint64(s, end, &value));

  if (has_sign) {
    // abs(INTN_MIN) == INTN_MAX + 1.
    if (value > static_cast<uint64_t>(std::numeric_limits<S>::max()) + 1) {
      return Result::Error;
    }
    value = std::numeric_limits<U>::max() - value + 1;
  } else {
    if (value > static_cast<uint64_t>(std::numeric_limits<U>::max())) {
      return Result::Error;
    }
  }
  *out = static_cast<U>(value);
  return Result::Ok;
}